

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O0

void __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::add_neighbours
          (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this,
          Vertex_handle v,Simplex *n,bool keep_only_superior)

{
  type_conflict1 tVar1;
  int iVar2;
  reference rVar3;
  undefined1 uVar4;
  undefined7 in_register_00000009;
  Vertex_handle local_9c;
  tuples local_98 [4];
  Vertex_handle value;
  pair<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_long>,_boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_long>_>
  local_88;
  undefined1 local_58 [8];
  boost_adjacency_iterator ai_end;
  boost_adjacency_iterator ai;
  bool keep_only_superior_local;
  Simplex *n_local;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this_local;
  Vertex_handle v_local;
  
  uVar4 = keep_only_superior;
  boost::
  adjacency_iterator<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_long>
  ::adjacency_iterator
            ((adjacency_iterator<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_long>
              *)&ai_end.m_g);
  boost::
  adjacency_iterator<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_long>
  ::adjacency_iterator
            ((adjacency_iterator<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_long>
              *)local_58);
  boost::
  adjacent_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>,boost::vecS,boost::setS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>,boost::vecS,boost::setS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>::config>>
            (&local_88,(boost *)(long)v.vertex,(vertex_descriptor)&this->skeleton,
             (adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config>_>
              *)CONCAT71(in_register_00000009,uVar4));
  boost::tuples::
  tie<boost::adjacency_iterator<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>,unsigned_long,boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>>,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>>,unsigned_long,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>,long>,boost::adjacency_iterator<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>,unsigned_long,boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>>,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>>,unsigned_long,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>,long>>
            (local_98,(adjacency_iterator<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_long>
                       *)&ai_end.m_g,
             (adjacency_iterator<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_long>
              *)local_58);
  boost::tuples::
  tuple<boost::adjacency_iterator<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>,unsigned_long,boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>>,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>>,unsigned_long,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>,long>&,boost::adjacency_iterator<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>,unsigned_long,boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>>,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>>,unsigned_long,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>,long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::adjacency_iterator<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>,unsigned_long,boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>>,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>>,unsigned_long,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>,long>&,boost::adjacency_iterator<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>,unsigned_long,boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>>,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>>,unsigned_long,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>,long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)local_98,&local_88);
  while (tVar1 = boost::iterators::operator!=
                           ((iterator_facade<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_long>,_unsigned_long,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_unsigned_long,_long>
                             *)&ai_end.m_g,
                            (iterator_facade<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_long>,_unsigned_long,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_unsigned_long,_long>
                             *)local_58), tVar1) {
    rVar3 = boost::iterators::detail::
            iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_long>,_unsigned_long,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_unsigned_long,_long,_false,_false>
            ::operator*((iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_long>,_unsigned_long,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_unsigned_long,_long,_false,_false>
                         *)&ai_end.m_g);
    Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
              (&local_9c,(boost_vertex_handle)rVar3);
    if (keep_only_superior) {
      iVar2 = Skeleton_blocker_simple_traits::Vertex_handle::operator_cast_to_int(&local_9c);
      if (v.vertex < iVar2) {
        Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
        ::add_vertex(n,local_9c);
      }
    }
    else {
      Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
      ::add_vertex(n,local_9c);
    }
    boost::iterators::detail::
    iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_long>,_unsigned_long,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_unsigned_long,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_long>,_unsigned_long,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_unsigned_long,_long,_false,_false>
                  *)&ai_end.m_g);
  }
  return;
}

Assistant:

virtual void add_neighbours(Vertex_handle v, Simplex & n,
                              bool keep_only_superior = false) const {
    boost_adjacency_iterator ai, ai_end;
    for (tie(ai, ai_end) = adjacent_vertices(v.vertex, skeleton); ai != ai_end;
         ++ai) {
      Vertex_handle value(*ai);
      if (keep_only_superior) {
        if (value > v.vertex) {
          n.add_vertex(value);
        }
      } else {
        n.add_vertex(value);
      }
    }
  }